

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  mapped_type *this_00;
  int i;
  long lVar1;
  long lVar2;
  OneofDescriptor *oneof;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  OneofGeneratorInfo info;
  string local_50;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(message + 0x70); lVar1 = lVar1 + 1) {
    InitializeFieldGeneratorInfoForMessage(this,(Descriptor *)(*(long *)(message + 0x38) + lVar2));
    lVar2 = lVar2 + 0x88;
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve(&fields,(long)*(int *)(message + 4));
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(message + 4); lVar1 = lVar1 + 1) {
    info.name._M_dataplus._M_p = (pointer)(*(long *)(message + 0x28) + lVar2);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::emplace_back<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&fields,(FieldDescriptor **)&info);
    lVar2 = lVar2 + 0x48;
  }
  InitializeFieldGeneratorInfoForFields(this,&fields);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(message + 0x68); lVar1 = lVar1 + 1) {
    info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
    info.name._M_string_length = 0;
    info.name.field_2._M_local_buf[0] = '\0';
    info.capitalized_name._M_dataplus._M_p = (pointer)&info.capitalized_name.field_2;
    info.capitalized_name._M_string_length = 0;
    oneof = (OneofDescriptor *)(*(long *)(message + 0x30) + lVar2);
    info.capitalized_name.field_2._M_local_buf[0] = '\0';
    UnderscoresToCamelCase(&local_50,*(string **)(*(long *)(message + 0x30) + 8 + lVar2),false);
    std::__cxx11::string::operator=((string *)&info,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    UnderscoresToCamelCase(&local_50,*(string **)(oneof + 8),true);
    std::__cxx11::string::operator=((string *)&info.capitalized_name,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = std::
              map<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
              ::operator[](&this->oneof_generator_info_map_,&oneof);
    OneofGeneratorInfo::operator=(this_00,&info);
    OneofGeneratorInfo::~OneofGeneratorInfo(&info);
    lVar2 = lVar2 + 0x28;
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  fields.reserve(message->field_count());
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}